

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_cached_string.c
# Opt level: O0

uintptr_t ht_feature_cached_string_add_mapping_
                    (HT_Timeline *timeline,HT_HashMap *map,uintptr_t hash,char *label)

{
  char *pcVar1;
  HT_EventKlass *pHVar2;
  HT_EventIdProvider *provider;
  undefined1 local_88 [8];
  HT_StringMappingEvent ev;
  HT_Event ht_base_event;
  char *ret;
  HT_FeatureCachedString *pHStack_38;
  HT_ErrorCode error_code;
  HT_FeatureCachedString *f;
  char *label_local;
  uintptr_t hash_local;
  HT_HashMap *map_local;
  HT_Timeline *timeline_local;
  
  f = (HT_FeatureCachedString *)label;
  label_local = (char *)hash;
  hash_local = (uintptr_t)map;
  map_local = (HT_HashMap *)timeline;
  pHStack_38 = HT_FeatureCachedString_from_timeline(timeline);
  if (pHStack_38 != (HT_FeatureCachedString *)0x0) {
    if (pHStack_38->lock != (HT_Mutex *)0x0) {
      ht_mutex_lock(pHStack_38->lock);
    }
    pcVar1 = ht_hash_map_insert((HT_HashMap *)hash_local,(uint64_t)label_local,(char *)f,
                                (HT_ErrorCode *)((long)&ret + 4));
    if (pHStack_38->lock != (HT_Mutex *)0x0) {
      ht_mutex_unlock(pHStack_38->lock);
    }
    if (ret._4_4_ == 0) {
      if (pcVar1 == (char *)0x0) {
        ev.label = (char *)ht_HT_StringMappingEvent_get_event_klass_instance();
        pHVar2 = (HT_EventKlass *)ht_monotonic_clock_get_timestamp();
        provider = ht_timeline_get_id_provider((HT_Timeline *)map_local);
        ev.base.timestamp = ht_event_id_provider_next(provider);
        local_88 = (undefined1  [8])ev.label;
        ev.base.id = (HT_EventId)label_local;
        ev.identifier = (uint64_t)f;
        ev.base.klass = pHVar2;
        ht_timeline_push_event((HT_Timeline *)map_local,(HT_Event *)local_88);
      }
      timeline_local = (HT_Timeline *)label_local;
    }
    else {
      timeline_local = (HT_Timeline *)0x0;
    }
    return (uintptr_t)timeline_local;
  }
  __assert_fail("f",
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/lib/feature_cached_string.c"
                ,0x76,
                "uintptr_t ht_feature_cached_string_add_mapping_(HT_Timeline *, HT_HashMap *, uintptr_t, const char *)"
               );
}

Assistant:

static uintptr_t
ht_feature_cached_string_add_mapping_(HT_Timeline* timeline, HT_HashMap* map, uintptr_t hash, const char* label)
{
    HT_FeatureCachedString* f = HT_FeatureCachedString_from_timeline(timeline);
    HT_ErrorCode error_code;

    assert(f);

    HT_FCS_LOCK_(f);

    const char* ret = ht_hash_map_insert(map, hash, label, &error_code);

    HT_FCS_UNLOCK_(f);
    if (error_code != HT_ERR_OK)
    {
        return 0;
    }

    if (ret == NULL)
    {
        HT_TIMELINE_PUSH_EVENT(timeline, HT_StringMappingEvent, hash, label);
    }
    return hash;
}